

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O0

void CodeAperiodicity(double **aperiodicity,int f0_length,int fs,int fft_size,
                     double **coded_aperiodicity)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int xi_length;
  ulong uVar3;
  double *xi;
  double *y;
  double dVar4;
  int local_50;
  int local_4c;
  int j;
  int i_1;
  double *log_aperiodicity;
  int i;
  double *coarse_frequency_axis;
  int number_of_aperiodicities;
  double **coded_aperiodicity_local;
  int fft_size_local;
  int fs_local;
  int f0_length_local;
  double **aperiodicity_local;
  
  xi_length = GetNumberOfAperiodicities(fs);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)xi_length;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar3);
  for (log_aperiodicity._4_4_ = 0; log_aperiodicity._4_4_ < xi_length;
      log_aperiodicity._4_4_ = log_aperiodicity._4_4_ + 1) {
    xi[log_aperiodicity._4_4_] = ((double)log_aperiodicity._4_4_ + 1.0) * 3000.0;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(fft_size / 2 + 1);
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  y = (double *)operator_new__(uVar3);
  for (local_4c = 0; local_4c < f0_length; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < fft_size / 2 + 1; local_50 = local_50 + 1) {
      dVar4 = log10(aperiodicity[local_4c][local_50]);
      y[local_50] = dVar4 * 20.0;
    }
    interp1Q(0.0,(double)fs / (double)fft_size,y,fft_size / 2 + 1,xi,xi_length,
             coded_aperiodicity[local_4c]);
  }
  if (xi != (double *)0x0) {
    operator_delete__(xi);
  }
  if (y != (double *)0x0) {
    operator_delete__(y);
  }
  return;
}

Assistant:

void CodeAperiodicity(const double * const *aperiodicity, int f0_length,
    int fs, int fft_size, double **coded_aperiodicity) {
  int number_of_aperiodicities = GetNumberOfAperiodicities(fs);
  double *coarse_frequency_axis = new double[number_of_aperiodicities];
  for (int i = 0; i < number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = world::kFrequencyInterval * (i + 1.0);

  double *log_aperiodicity = new double[fft_size / 2 + 1];

  for (int i = 0; i < f0_length; ++i) {
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      log_aperiodicity[j] = 20 * log10(aperiodicity[i][j]);
    interp1Q(0, static_cast<double>(fs) / fft_size, log_aperiodicity,
        fft_size / 2 + 1, coarse_frequency_axis, number_of_aperiodicities,
        coded_aperiodicity[i]);
  }

  delete[] coarse_frequency_axis;
  delete[] log_aperiodicity;
}